

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O0

void __thiscall CaDiCaL::Internal::analyze(Internal *this)

{
  size_t sVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  size_type sVar5;
  Clause *pCVar6;
  reference puVar7;
  uint *puVar8;
  Flags *pFVar9;
  Var *pVVar10;
  Internal *pIVar11;
  time_t *in_RSI;
  time_t *ptVar12;
  Internal *in_RDI;
  double s;
  double s_00;
  double s_01;
  double s_02;
  double s_03;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int new_level;
  Clause *driving_clause;
  Internal *in_stack_00000070;
  int jump;
  unsigned_long id_1;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  int glue;
  int size;
  int lit;
  int new_level_1;
  int conflict_level_1;
  int forced_1;
  unsigned_long id;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range4;
  int other;
  bool otfs;
  int resolved;
  int conflict_size;
  int antecedent_size;
  int resolvent_size;
  int uip;
  int open;
  int i;
  vector<int,_std::allocator<int>_> **t;
  Clause *reason;
  int conflict_level;
  int forced;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffeb8;
  Internal *pIVar15;
  Internal *in_stack_fffffffffffffec0;
  Profile *pPVar16;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffec8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffed0;
  int *in_stack_fffffffffffffed8;
  Internal *in_stack_fffffffffffffee0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffee8;
  Internal *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  int iVar17;
  Internal *in_stack_ffffffffffffff00;
  Profile *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  Internal *in_stack_ffffffffffffff20;
  int local_d4;
  Internal *in_stack_ffffffffffffff40;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_a8;
  int local_9c;
  int local_98;
  int local_94;
  uint local_90;
  int local_8c;
  int local_88;
  uint local_84;
  unsigned_long local_80;
  unsigned_long *local_78;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_68;
  unsigned_long *local_60;
  unsigned_long *local_58;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  int uip_00;
  int iVar18;
  int iVar19;
  int iVar20;
  int local_30;
  int local_2c;
  vector<int,_std::allocator<int>_> *local_28;
  Internal *in_stack_ffffffffffffffe0;
  vector<int,_std::allocator<int>_> **ppvVar21;
  Clause *local_18;
  uint local_c;
  
  if ((in_RDI->internal->profiles).analyze.level <= (in_RDI->internal->opts).profile) {
    in_stack_ffffffffffffff00 = in_RDI->internal;
    in_stack_ffffffffffffff08 = &(in_RDI->internal->profiles).analyze;
    time(in_RDI->internal,in_RSI);
    start_profiling(in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,s);
  }
  sVar1 = in_RDI->num_assigned;
  auVar13._8_4_ = (int)(sVar1 >> 0x20);
  auVar13._0_8_ = sVar1;
  auVar13._12_4_ = 0x45300000;
  EMA::update(&(in_RDI->averages).current.trail.fast,in_RDI->internal,
              (auVar13._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0),
              "averages.current.trail.fast");
  pIVar11 = in_RDI->internal;
  sVar1 = in_RDI->num_assigned;
  auVar14._8_4_ = (int)(sVar1 >> 0x20);
  auVar14._0_8_ = sVar1;
  auVar14._12_4_ = 0x45300000;
  EMA::update(&(in_RDI->averages).current.trail.slow,pIVar11,
              (auVar14._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0),
              "averages.current.trail.slow");
  if ((((in_RDI->external_prop & 1U) != 0) && ((in_RDI->external_prop_is_lazy & 1U) == 0)) &&
     ((in_RDI->opts).exteagerreasons != 0)) {
    explain_external_propagations(in_stack_ffffffffffffffe0);
  }
  if (((in_RDI->opts).chrono != 0) || ((in_RDI->external_prop & 1U) != 0)) {
    uVar3 = find_conflict_level(in_stack_ffffffffffffff20,
                                (int *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
                               );
    iVar17 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
    if (local_c != 0) {
      backtrack(in_stack_ffffffffffffff00,iVar17);
      iVar18 = (int)((ulong)in_stack_fffffffffffffec8._M_current >> 0x20);
      build_chain_for_units
                (in_stack_ffffffffffffff00,iVar17,(Clause *)in_stack_fffffffffffffef0,
                 SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0));
      ptVar12 = (time_t *)(ulong)local_c;
      search_assign_driving
                ((Internal *)in_stack_fffffffffffffed0._M_current,iVar18,
                 (Clause *)in_stack_fffffffffffffec0);
      in_RDI->conflict = (Clause *)0x0;
      if ((in_RDI->internal->opts).profile < (in_RDI->internal->profiles).analyze.level) {
        return;
      }
      pIVar11 = in_RDI->internal;
      pPVar16 = &(in_RDI->internal->profiles).analyze;
      time(in_RDI->internal,ptVar12);
      stop_profiling(pIVar11,pPVar16,s_00);
      return;
    }
    pIVar11 = (Internal *)(ulong)uVar3;
    backtrack(in_stack_ffffffffffffff00,iVar17);
  }
  if (in_RDI->level == 0) {
    learn_empty_clause((Internal *)in_stack_fffffffffffffed0._M_current);
    if (in_RDI->external->learner != (Learner *)0x0) {
      External::export_learned_empty_clause((External *)in_stack_fffffffffffffec0);
    }
    if ((in_RDI->internal->profiles).analyze.level <= (in_RDI->internal->opts).profile) {
      pIVar15 = in_RDI->internal;
      pPVar16 = &(in_RDI->internal->profiles).analyze;
      time(in_RDI->internal,(time_t *)pIVar11);
      stop_profiling(pIVar15,pPVar16,s_01);
    }
    return;
  }
  local_18 = in_RDI->conflict;
  local_28 = &in_RDI->trail;
  ppvVar21 = &local_28;
  sVar5 = std::vector<int,_std::allocator<int>_>::size(local_28);
  local_2c = (int)sVar5;
  local_30 = 0;
  uVar3 = 0;
  iVar20 = 0;
  iVar18 = 0;
  uip_00 = 0;
  iVar17 = (in_RDI->opts).otfs;
  do {
    iVar19 = 1;
    analyze_reason(in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                   (Clause *)in_stack_fffffffffffffef0,(int *)in_stack_fffffffffffffee8,
                   &in_stack_fffffffffffffee0->mode,in_stack_fffffffffffffed8);
    if (uip_00 == 0) {
      iVar18 = iVar19 + -1;
    }
    if (((iVar17 != 0) && (0 < uip_00)) && ((2 < iVar19 && (iVar20 < iVar19)))) {
      in_stack_ffffffffffffffb4 =
           *(uint *)&local_18[1].field_0 ^ *(uint *)((long)&local_18[1].field_0 + 4) ^ uVar3;
      pCVar6 = on_the_fly_strengthen
                         ((Internal *)CONCAT44(uVar3,iVar20),(Clause *)CONCAT44(iVar19,iVar18),
                          uip_00);
      if ((in_RDI->opts).bump != 0) {
        bump_variables(in_stack_ffffffffffffff40);
      }
      if (pCVar6 == (Clause *)0x0) {
        uVar3 = -in_stack_ffffffffffffffb4;
        local_58 = (unsigned_long *)
                   std::begin<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                             (in_stack_fffffffffffffeb8);
        local_60 = (unsigned_long *)
                   std::end<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                             (in_stack_fffffffffffffeb8);
        std::
        reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        local_68 = &in_RDI->mini_chain;
        local_70._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       (in_stack_fffffffffffffeb8);
        local_78 = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                             (in_stack_fffffffffffffeb8);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   *)in_stack_fffffffffffffec0,
                                  (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   *)in_stack_fffffffffffffeb8), bVar2) {
          puVar7 = __gnu_cxx::
                   __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator*(&local_70);
          local_80 = *puVar7;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffed0._M_current,in_stack_fffffffffffffec8._M_current);
          __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&local_70);
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xd44e77);
        clear_analyzed_levels(in_stack_fffffffffffffee0);
        std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0xd44e92)
        ;
LAB_00d45259:
        local_94 = -uVar3;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0,
                   (value_type_conflict3 *)in_stack_fffffffffffffeb8);
        sVar5 = std::vector<int,_std::allocator<int>_>::size(&in_RDI->clause);
        local_98 = (int)sVar5;
        sVar5 = std::vector<int,_std::allocator<int>_>::size(&in_RDI->levels);
        local_9c = (int)sVar5 + -1;
        EMA::update((EMA *)&(in_RDI->averages).current,in_RDI->internal,(double)local_9c,
                    "averages.current.glue.fast");
        EMA::update(&(in_RDI->averages).current.glue.slow,in_RDI->internal,(double)local_9c,
                    "averages.current.glue.slow");
        (in_RDI->stats).learned.literals = (long)local_98 + (in_RDI->stats).learned.literals;
        (in_RDI->stats).learned.clauses = (in_RDI->stats).learned.clauses + 1;
        if (local_98 < 2) {
          if (in_RDI->external->learner != (Learner *)0x0) {
            External::export_learned_unit_clause
                      ((External *)in_stack_fffffffffffffec0,
                       (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
          }
        }
        else {
          if ((in_RDI->opts).shrink == 0) {
            if ((in_RDI->opts).minimize != 0) {
              minimize_clause((Internal *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
            }
          }
          else {
            shrink_and_minimize_clause(in_stack_00000070);
          }
          sVar5 = std::vector<int,_std::allocator<int>_>::size(&in_RDI->clause);
          local_98 = (int)sVar5;
          if ((in_RDI->opts).bump != 0) {
            bump_variables(in_stack_ffffffffffffff40);
          }
          if (in_RDI->external->learner != (Learner *)0x0) {
            External::export_learned_large_clause
                      ((External *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          }
        }
        (in_RDI->stats).units = (ulong)(local_98 == 1) + (in_RDI->stats).units;
        (in_RDI->stats).binaries = (ulong)(local_98 == 2) + (in_RDI->stats).binaries;
        EMA::update(&(in_RDI->averages).current.size,in_RDI->internal,(double)local_98,
                    "averages.current.size");
        iVar17 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
        if ((in_RDI->lrat & 1U) != 0) {
          local_a8 = &in_RDI->unit_chain;
          local_b0._M_current =
               (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         (in_stack_fffffffffffffeb8);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_fffffffffffffeb8)
          ;
          while( true ) {
            bVar2 = __gnu_cxx::operator!=
                              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)in_stack_fffffffffffffec0,
                               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)in_stack_fffffffffffffeb8);
            iVar17 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
            if (!bVar2) break;
            __gnu_cxx::
            __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator*(&local_b0);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffed0._M_current,in_stack_fffffffffffffec8._M_current);
            __gnu_cxx::
            __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator++(&local_b0);
          }
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xd4555d);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    (in_stack_fffffffffffffeb8);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_fffffffffffffeb8)
          ;
          std::
          reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        }
        iVar18 = (int)((ulong)in_stack_fffffffffffffec8._M_current >> 0x20);
        pIVar11 = (Internal *)
                  new_driving_clause(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                                     &in_RDI->mode);
        EMA::update(&(in_RDI->averages).current.jump,in_RDI->internal,(double)local_d4,
                    "averages.current.jump");
        uVar4 = determine_actual_backtrack_level(pIVar11,in_stack_ffffffffffffff1c);
        EMA::update(&(in_RDI->averages).current.level,in_RDI->internal,(double)(int)uVar4,
                    "averages.current.level");
        ptVar12 = (time_t *)(ulong)uVar4;
        backtrack(in_stack_ffffffffffffff00,iVar17);
        if (uVar3 == 0) {
          learn_empty_clause((Internal *)in_stack_fffffffffffffed0._M_current);
        }
        else {
          ptVar12 = (time_t *)(ulong)-uVar3;
          search_assign_driving
                    ((Internal *)in_stack_fffffffffffffed0._M_current,iVar18,
                     (Clause *)in_stack_fffffffffffffec0);
        }
        if ((in_RDI->stable & 1U) != 0) {
          Reluctant::tick(&in_RDI->reluctant);
        }
        clear_analyzed_literals(in_stack_fffffffffffffee0);
        clear_unit_analyzed_literals(in_stack_fffffffffffffee0);
        clear_analyzed_levels(in_stack_fffffffffffffee0);
        std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0xd456b5)
        ;
        in_RDI->conflict = (Clause *)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xd456d1);
        if ((in_RDI->internal->profiles).analyze.level <= (in_RDI->internal->opts).profile) {
          pIVar15 = in_RDI->internal;
          pPVar16 = &(in_RDI->internal->profiles).analyze;
          time(in_RDI->internal,ptVar12);
          stop_profiling(pIVar15,pPVar16,s_03);
        }
        if (pIVar11 == (Internal *)0x0) {
          return;
        }
        if ((in_RDI->opts).eagersubsume == 0) {
          return;
        }
        eagerly_subsume_recently_learned_clauses(in_RDI,(Clause *)in_stack_ffffffffffffff08);
        return;
      }
      if ((uip_00 == 1) && (iVar20 < iVar18)) {
        otfs_subsume_clause((Internal *)in_stack_fffffffffffffed0._M_current,
                            (Clause *)in_stack_fffffffffffffec8._M_current,
                            (Clause *)in_stack_fffffffffffffec0);
        (in_RDI->stats).otfs.subsumed = (in_RDI->stats).otfs.subsumed + 1;
        (in_RDI->stats).subsumed = (in_RDI->stats).subsumed + 1;
        (in_RDI->stats).conflicts = (in_RDI->stats).conflicts + 1;
      }
      iVar18 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
      in_RDI->conflict = pCVar6;
      if (local_30 == 1) {
        local_84 = 0;
        local_88 = otfs_find_backtrack_level
                             (in_stack_fffffffffffffef0,(int *)in_stack_fffffffffffffee8);
        iVar17 = (int)((ulong)in_stack_fffffffffffffec8._M_current >> 0x20);
        local_8c = determine_actual_backtrack_level
                             (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
        EMA::update(&(in_RDI->averages).current.level,in_RDI->internal,(double)local_8c,
                    "averages.current.level");
        backtrack(in_stack_ffffffffffffff00,iVar18);
        ptVar12 = (time_t *)(ulong)local_84;
        search_assign_driving
                  ((Internal *)in_stack_fffffffffffffed0._M_current,iVar17,
                   (Clause *)in_stack_fffffffffffffec0);
        in_RDI->conflict = (Clause *)0x0;
        clear_analyzed_literals(in_stack_fffffffffffffee0);
        clear_analyzed_levels(in_stack_fffffffffffffee0);
        std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0xd4500b)
        ;
        if ((in_RDI->internal->opts).profile < (in_RDI->internal->profiles).analyze.level) {
          return;
        }
        pIVar11 = in_RDI->internal;
        pPVar16 = &(in_RDI->internal->profiles).analyze;
        time(in_RDI->internal,ptVar12);
        stop_profiling(pIVar11,pPVar16,s_02);
        return;
      }
      uip_00 = 0;
      clear_analyzed_literals(in_stack_fffffffffffffee0);
      std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0xd4509c);
      iVar20 = 0;
      iVar18 = 1;
      local_30 = 0;
      analyze_reason(in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                     (Clause *)in_stack_fffffffffffffef0,(int *)in_stack_fffffffffffffee8,
                     &in_stack_fffffffffffffee0->mode,in_stack_fffffffffffffed8);
      iVar18 = iVar18 + -1;
    }
    uip_00 = uip_00 + 1;
    uVar3 = 0;
    while (uVar3 == 0) {
      local_2c = local_2c + -1;
      puVar8 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](*ppvVar21,(long)local_2c);
      local_90 = *puVar8;
      pFVar9 = flags(in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      if ((((uint)*pFVar9 & 1) != 0) &&
         (pVVar10 = var(in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20)),
         pVVar10->level == in_RDI->level)) {
        uVar3 = local_90;
      }
    }
    local_30 = local_30 + -1;
    if (local_30 == 0) goto LAB_00d45259;
    pVVar10 = var(in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    local_18 = pVVar10->reason;
    if (local_18 == in_RDI->external_reason) {
      local_18 = learn_external_reason_clause
                           (in_RDI,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                            (int)in_stack_ffffffffffffff08,
                            SUB81((ulong)in_stack_ffffffffffffff00 >> 0x38,0));
      in_stack_fffffffffffffec8._M_current = (unsigned_long *)local_18;
      pVVar10 = var(in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      pVVar10->reason = (Clause *)in_stack_fffffffffffffec8._M_current;
    }
    iVar20 = iVar20 + -1;
  } while( true );
}

Assistant:

void Internal::analyze () {

  START (analyze);

  assert (conflict);
  assert (lrat_chain.empty ());
  assert (unit_chain.empty ());
  assert (unit_analyzed.empty ());
  assert (clause.empty ());

  // First update moving averages of trail height at conflict.
  //
  UPDATE_AVERAGE (averages.current.trail.fast, num_assigned);
  UPDATE_AVERAGE (averages.current.trail.slow, num_assigned);

  /*----------------------------------------------------------------------*/

  if (external_prop && !external_prop_is_lazy && opts.exteagerreasons) {
    explain_external_propagations ();
  }

  if (opts.chrono || external_prop) {

    int forced;

    const int conflict_level = find_conflict_level (forced);

    // In principle we can perform conflict analysis as in non-chronological
    // backtracking except if there is only one literal with the maximum
    // assignment level in the clause.  Then standard conflict analysis is
    // unnecessary and we can use the conflict as a driving clause.  In the
    // pseudo code of the SAT'18 paper on chronological backtracking this
    // corresponds to the situation handled in line 4-6 in Alg. 1, except
    // that the pseudo code in the paper only backtracks while we eagerly
    // assign the single literal on the highest decision level.

    if (forced) {

      assert (forced);
      assert (conflict_level > 0);
      LOG ("single highest level literal %d", forced);

      // The pseudo code in the SAT'18 paper actually backtracks to the
      // 'second highest decision' level, while their code backtracks
      // to 'conflict_level-1', which is more in the spirit of chronological
      // backtracking anyhow and thus we also do the latter.
      //
      backtrack (conflict_level - 1);

      // if we are on decision level 0 search assign will learn unit
      // so we need a valid chain here (of course if we are not on decision
      // level 0 this will not result in a valid chain).
      // we can just use build_chain_for_units in propagate
      //
      build_chain_for_units (forced, conflict, 0);

      LOG ("forcing %d", forced);
      search_assign_driving (forced, conflict);

      conflict = 0;
      STOP (analyze);
      return;
    }

    // Backtracking to the conflict level is in the pseudo code in the
    // SAT'18 chronological backtracking paper, but not in their actual
    // implementation.  In principle we do not need to backtrack here.
    // However, as a side effect of backtracking to the conflict level we
    // set 'level' to the conflict level which then allows us to reuse the
    // old 'analyze' code as is.  The alternative (which we also tried but
    // then abandoned) is to use 'conflict_level' instead of 'level' in the
    // analysis, which however requires to pass it to the 'analyze_reason'
    // and 'analyze_literal' functions.
    //
    backtrack (conflict_level);
  }

  // Actual conflict on root level, thus formula unsatisfiable.
  //
  if (!level) {
    learn_empty_clause ();
    if (external->learner)
      external->export_learned_empty_clause ();
    // lrat_chain.clear (); done in learn_empty_clause
    STOP (analyze);
    return;
  }

  /*----------------------------------------------------------------------*/

  // First derive the 1st UIP clause by going over literals assigned on the
  // current decision level.  Literals in the conflict are marked as 'seen'
  // as well as all literals in reason clauses of already 'seen' literals on
  // the current decision level.  Thus the outer loop starts with the
  // conflict clause as 'reason' and then uses the 'reason' of the next
  // seen literal on the trail assigned on the current decision level.
  // During this process maintain the number 'open' of seen literals on the
  // current decision level with not yet processed 'reason'.  As soon 'open'
  // drops to one, we have found the first unique implication point.  This
  // is sound because the topological order in which literals are processed
  // follows the assignment order and a more complex algorithm to find
  // articulation points is not necessary.
  //
  Clause *reason = conflict;
  LOG (reason, "analyzing conflict");

  assert (clause.empty ());
  assert (lrat_chain.empty ());

  const auto &t = &trail;
  int i = t->size ();      // Start at end-of-trail.
  int open = 0;            // Seen but not processed on this level.
  int uip = 0;             // The first UIP literal.
  int resolvent_size = 0;  // without the uip
  int antecedent_size = 1; // with the uip and without unit literals
  int conflict_size =
      0; // size of the conflict without the uip and without unit literals
  int resolved = 0; // number of resolution (0 = clause in CNF)
  const bool otfs = opts.otfs;

  for (;;) {
    antecedent_size = 1; // for uip
    analyze_reason (uip, reason, open, resolvent_size, antecedent_size);
    if (resolved == 0)
      conflict_size = antecedent_size - 1;
    assert (resolvent_size == open + (int) clause.size ());

    if (otfs && resolved > 0 && antecedent_size > 2 &&
        resolvent_size < antecedent_size) {
      assert (reason != conflict);
      LOG (analyzed, "found candidate for OTFS conflict");
      LOG (clause, "found candidate for OTFS conflict");
      LOG (reason, "found candidate (size %d) for OTFS resolvent",
           antecedent_size);
      const int other = reason->literals[0] ^ reason->literals[1] ^ uip;
      assert (other != uip);
      reason = on_the_fly_strengthen (reason, uip);
      if (opts.bump)
        bump_variables ();

      assert (conflict_size);
      if (!reason) {
        uip = -other;
        assert (open == 1);
        LOG ("clause is actually unit %d, stopping", -uip);
        reverse (begin (mini_chain), end (mini_chain));
        for (auto id : mini_chain)
          lrat_chain.push_back (id);
        mini_chain.clear ();
        clear_analyzed_levels ();
        assert (!opts.exteagerreasons);
        clause.clear ();
        break;
      }
      assert (conflict_size >= 2);

      if (resolved == 1 && resolvent_size < conflict_size) {
        // in this case both clauses are part of the CNF, so one subsumes
        // the other
        otfs_subsume_clause (reason, conflict);
        LOG (reason, "changing conflict to");
        --conflict_size;
        assert (conflict_size == reason->size);
        ++stats.otfs.subsumed;
        ++stats.subsumed;
        ++stats.conflicts;
      }

      LOG (reason, "changing conflict to");
      conflict = reason;
      if (open == 1) {
        int forced = 0;
        const int conflict_level = otfs_find_backtrack_level (forced);
        int new_level = determine_actual_backtrack_level (conflict_level);
        UPDATE_AVERAGE (averages.current.level, new_level);
        backtrack (new_level);

        LOG ("forcing %d", forced);
        search_assign_driving (forced, conflict);

        conflict = 0;
        // Clean up.
        //
        clear_analyzed_literals ();
        clear_analyzed_levels ();
        clause.clear ();
        STOP (analyze);
        return;
      }

      resolved = 0;
      clear_analyzed_literals ();
      // clear_analyzed_levels (); not needed because marking the exact same
      // again
      clause.clear ();
      resolvent_size = 0;
      antecedent_size = 1;
      open = 0;
      analyze_reason (0, reason, open, resolvent_size, antecedent_size);
      conflict_size = antecedent_size - 1;
      assert (open > 1);
    }

    ++resolved;

    uip = 0;
    while (!uip) {
      assert (i > 0);
      const int lit = (*t)[--i];
      if (!flags (lit).seen)
        continue;
      if (var (lit).level == level)
        uip = lit;
    }
    if (!--open)
      break;
    reason = var (uip).reason;
    if (reason == external_reason) {
      assert (!opts.exteagerreasons);
      reason = learn_external_reason_clause (-uip, 0, true);
      var (uip).reason = reason;
    }
    assert (reason != external_reason);
    LOG (reason, "analyzing %d reason", uip);
    assert (resolvent_size);
    --resolvent_size;
  }
  LOG ("first UIP %d", uip);
  clause.push_back (-uip);

  // Update glue and learned (1st UIP literals) statistics.
  //
  int size = (int) clause.size ();
  const int glue = (int) levels.size () - 1;
  LOG (clause, "1st UIP size %d and glue %d clause", size, glue);
  UPDATE_AVERAGE (averages.current.glue.fast, glue);
  UPDATE_AVERAGE (averages.current.glue.slow, glue);
  stats.learned.literals += size;
  stats.learned.clauses++;
  assert (glue < size);

  // up to this point lrat_chain contains the proof for current clause in
  // reversed order. in minimize and shrink the clause is changed and
  // therefore lrat_chain has to be extended. Unfortunately we cannot create
  // the chain directly during minimization (or shrinking) but afterwards we
  // can calculate it pretty easily and even better the same algorithm works
  // for both shrinking and minimization.

  // Minimize the 1st UIP clause as pioneered by Niklas Soerensson in
  // MiniSAT and described in our joint SAT'09 paper.
  //
  if (size > 1) {
    if (opts.shrink)
      shrink_and_minimize_clause ();
    else if (opts.minimize)
      minimize_clause ();

    size = (int) clause.size ();

    // Update decision heuristics.
    //
    if (opts.bump)
      bump_variables ();

    if (external->learner)
      external->export_learned_large_clause (clause);
  } else if (external->learner)
    external->export_learned_unit_clause (-uip);

  // Update actual size statistics.
  //
  stats.units += (size == 1);
  stats.binaries += (size == 2);
  UPDATE_AVERAGE (averages.current.size, size);

  // reverse lrat_chain. We could probably work with reversed iterators
  // (views) to be more efficient but we would have to distinguish in proof
  //
  if (lrat) {
    LOG (unit_chain, "unit chain: ");
    for (auto id : unit_chain)
      lrat_chain.push_back (id);
    unit_chain.clear ();
    reverse (lrat_chain.begin (), lrat_chain.end ());
  }

  // Determine back-jump level, learn driving clause, backtrack and assign
  // flipped 1st UIP literal.
  //
  int jump;
  Clause *driving_clause = new_driving_clause (glue, jump);
  UPDATE_AVERAGE (averages.current.jump, jump);

  int new_level = determine_actual_backtrack_level (jump);
  UPDATE_AVERAGE (averages.current.level, new_level);
  backtrack (new_level);

  // It should hold that (!level <=> size == 1)
  //                 and (!uip   <=> size == 0)
  // this means either we have already learned a clause => size >= 2
  // in this case we will not learn empty clause or unit here
  // or we haven't actually learned a clause in new_driving_clause
  // then lrat_chain is still valid and we will learn a unit or empty clause
  //
  if (uip) {
    search_assign_driving (-uip, driving_clause);
  } else
    learn_empty_clause ();

  if (stable)
    reluctant.tick (); // Reluctant has its own 'conflict' counter.

  // Clean up.
  //
  clear_analyzed_literals ();
  clear_unit_analyzed_literals ();
  clear_analyzed_levels ();
  clause.clear ();
  conflict = 0;

  lrat_chain.clear ();
  STOP (analyze);

  if (driving_clause && opts.eagersubsume)
    eagerly_subsume_recently_learned_clauses (driving_clause);
}